

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaFreeIDCStateObjList(xmlSchemaIDCStateObjPtr_conflict sto)

{
  xmlSchemaIDCStateObjPtr pxVar1;
  
  while (sto != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    pxVar1 = sto->next;
    if (sto->history != (int *)0x0) {
      (*xmlFree)(sto->history);
    }
    if ((xmlStreamCtxtPtr)sto->xpathCtxt != (xmlStreamCtxtPtr)0x0) {
      xmlFreeStreamCtxt((xmlStreamCtxtPtr)sto->xpathCtxt);
    }
    (*xmlFree)(sto);
    sto = pxVar1;
  }
  return;
}

Assistant:

static void
xmlSchemaFreeIDCStateObjList(xmlSchemaIDCStateObjPtr sto)
{
    xmlSchemaIDCStateObjPtr next;
    while (sto != NULL) {
	next = sto->next;
	if (sto->history != NULL)
	    xmlFree(sto->history);
	if (sto->xpathCtxt != NULL)
	    xmlFreeStreamCtxt((xmlStreamCtxtPtr) sto->xpathCtxt);
	xmlFree(sto);
	sto = next;
    }
}